

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DefUseManager::EraseUseRecordsOfOperandIds
          (DefUseManager *this,Instruction *inst)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  uint32_t *puVar3;
  _Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
  __it;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  uint32_t *puVar7;
  pair<std::_Rb_tree_iterator<spvtools::opt::analysis::UserEntry>,_std::_Rb_tree_iterator<spvtools::opt::analysis::UserEntry>_>
  pVar8;
  key_type local_40;
  
  uVar1 = (this->inst_to_used_ids_)._M_h._M_bucket_count;
  uVar4 = (ulong)inst % uVar1;
  p_Var5 = (this->inst_to_used_ids_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Instruction *)p_Var5->_M_nxt[1]._M_nxt != inst)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Instruction *)p_Var2[1]._M_nxt == inst)) goto LAB_001fa0ca;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_001fa0ca:
  if (p_Var6 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    puVar7 = *(uint32_t **)((long)__it._M_cur + 0x10);
    puVar3 = *(uint32_t **)((long)__it._M_cur + 0x18);
    if (puVar7 != puVar3) {
      do {
        local_40.def = GetDef(this,*puVar7);
        local_40.user = inst;
        pVar8 = std::
                _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
                ::equal_range(&(this->id_to_users_)._M_t,&local_40);
        std::
        _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
        ::_M_erase_aux(&(this->id_to_users_)._M_t,(_Base_ptr)pVar8.first._M_node,
                       (_Base_ptr)pVar8.second._M_node);
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar3);
    }
    std::
    _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->inst_to_used_ids_)._M_h,(const_iterator)__it._M_cur);
  }
  return;
}

Assistant:

void DefUseManager::EraseUseRecordsOfOperandIds(const Instruction* inst) {
  // Go through all ids used by this instruction, remove this instruction's
  // uses of them.
  auto iter = inst_to_used_ids_.find(inst);
  if (iter != inst_to_used_ids_.end()) {
    for (auto use_id : iter->second) {
      id_to_users_.erase(
          UserEntry{GetDef(use_id), const_cast<Instruction*>(inst)});
    }
    inst_to_used_ids_.erase(iter);
  }
}